

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

int matrix2_equals(matrix2 *self,matrix2 *mT)

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  lVar1 = 0;
  do {
    if (lVar1 == 4) {
      return 1;
    }
    fVar2 = (self->field_0).m[lVar1] - (mT->field_0).m[lVar1];
    fVar3 = -fVar2;
    if (-fVar2 <= fVar2) {
      fVar3 = fVar2;
    }
    lVar1 = lVar1 + 1;
  } while (fVar3 < 1e-05);
  return 0;
}

Assistant:

HYPAPI int matrix2_equals(const struct matrix2 *self, const struct matrix2 *mT)
{
	uint8_t i;

	for (i = 0; i < 4; i++) {
		if (scalar_equalsf(self->m[i], mT->m[i]) == 0) {
			return 0;
		}
	}

	return 1;
}